

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conductor.hpp
# Opt level: O0

void __thiscall ConductorBRDF::sample_f(ConductorBRDF *this)

{
  Sampler *in_stack_00000428;
  float *in_stack_00000430;
  vec3f *in_stack_00000438;
  vec3f *in_stack_00000440;
  Color *in_stack_00000448;
  ConductorBRDF *in_stack_00000450;
  
  sample_f(in_stack_00000450,in_stack_00000448,in_stack_00000440,in_stack_00000438,in_stack_00000430
           ,in_stack_00000428);
  return;
}

Assistant:

Color sample_f(const Color& albedo, const vec3f& wo, vec3f& wi, float& pdf, Sampler& sampler) const override
	{
		wi = vec3f(-wo.x, -wo.y, wo.z);
		float cos = fabs(wo.z);
		pdf = 1;
		Color t1 = (eta*eta + k*k) * (cos*cos);
		Color r1 = (t1 - 2*eta*cos + 1) / (t1 + 2*eta*cos + 1);
		Color t2 = eta*eta + k*k;
		Color r2 = (t2 - 2*eta*cos + Color(cos*cos)) / (t2 + 2*eta*cos + Color(cos*cos));
		return 0.5 / cos * (r1 + r2) * albedo;
	}